

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenDropSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  if (expr->_id != DropId) {
    __assert_fail("expression->is<Drop>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xb84,"void BinaryenDropSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xb85,"void BinaryenDropSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenDropSetValue(BinaryenExpressionRef expr,
                          BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Drop>());
  assert(valueExpr);
  static_cast<Drop*>(expression)->value = (Expression*)valueExpr;
}